

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

Expression *
slang::ast::CopyClassExpression::fromSyntax
          (Compilation *compilation,CopyClassExpressionSyntax *syntax,ASTContext *context)

{
  Type *pTVar1;
  bool bVar2;
  Expression *pEVar3;
  CopyClassExpression *expr;
  Type *pTVar4;
  Diagnostic *diag;
  SourceRange local_38;
  
  pEVar3 = Expression::selfDetermined
                     (compilation,(syntax->expr).ptr,context,(bitmask<slang::ast::ASTFlags>)0x0);
  pTVar1 = (pEVar3->type).ptr;
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::CopyClassExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,pTVar1,pEVar3,&local_38);
  bVar2 = Expression::bad(pEVar3);
  if (!bVar2) {
    pTVar1 = (pEVar3->type).ptr;
    pTVar4 = pTVar1->canonical;
    if (pTVar4 == (Type *)0x0) {
      Type::resolveCanonical(pTVar1);
      pTVar4 = pTVar1->canonical;
    }
    if ((pTVar4->super_Symbol).kind == ClassType) {
      return &expr->super_Expression;
    }
    diag = ASTContext::addDiag(context,(DiagCode)0x440007,pEVar3->sourceRange);
    ast::operator<<(diag,(pEVar3->type).ptr);
  }
  pEVar3 = Expression::badExpr(compilation,&expr->super_Expression);
  return pEVar3;
}

Assistant:

Expression& CopyClassExpression::fromSyntax(Compilation& compilation,
                                            const CopyClassExpressionSyntax& syntax,
                                            const ASTContext& context) {
    auto& source = selfDetermined(compilation, *syntax.expr, context);
    auto result = compilation.emplace<CopyClassExpression>(*source.type, source,
                                                           syntax.sourceRange());
    if (source.bad())
        return badExpr(compilation, result);

    if (!source.type->isClass()) {
        context.addDiag(diag::CopyClassTarget, source.sourceRange) << *source.type;
        return badExpr(compilation, result);
    }

    return *result;
}